

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
Release(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this)

{
  VulkanSyncObjectManager *this_00;
  
  this_00 = (this->m_pManager).
            super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00 != (VulkanSyncObjectManager *)0x0) && (this->m_VkSyncObject != (Type)0x0)) {
    Recycle(this_00,this->m_VkSyncObject,this->m_IsUnsignaled);
    this->m_VkSyncObject = (NativeType)0x0;
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *
               )this);
    return;
  }
  return;
}

Assistant:

void Release()
    {
        if (m_pManager && m_VkSyncObject != VK_NULL_HANDLE)
        {
            m_pManager->Recycle(VkSyncObjType{m_VkSyncObject}, m_IsUnsignaled);
            m_VkSyncObject = VK_NULL_HANDLE;
            m_pManager.reset();
        }
    }